

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_del_elem(node_data *data,uint index)

{
  long lVar1;
  rtr_socket *prVar2;
  uint8_t uVar3;
  undefined3 uVar4;
  uint32_t uVar5;
  uint8_t uVar6;
  undefined3 uVar7;
  data_elem *pdVar8;
  data_elem *pdVar9;
  long in_FS_OFFSET;
  uint local_44;
  uint i;
  data_elem *tmp;
  uint index_local;
  node_data *data_local;
  data_elem deleted_elem;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pdVar8 = data->ary + index;
  uVar5 = pdVar8->asn;
  uVar6 = pdVar8->max_len;
  uVar7 = *(undefined3 *)&pdVar8->field_0x5;
  prVar2 = pdVar8->socket;
  local_44 = index;
  if (index != data->len - 1) {
    for (; local_44 < data->len - 1; local_44 = local_44 + 1) {
      pdVar8 = data->ary + local_44;
      pdVar9 = data->ary + (local_44 + 1);
      uVar3 = pdVar9->max_len;
      uVar4 = *(undefined3 *)&pdVar9->field_0x5;
      pdVar8->asn = pdVar9->asn;
      pdVar8->max_len = uVar3;
      *(undefined3 *)&pdVar8->field_0x5 = uVar4;
      pdVar8->socket = pdVar9->socket;
    }
  }
  data->len = data->len - 1;
  if (data->len == 0) {
    lrtr_free(data->ary);
    data->ary = (data_elem *)0x0;
    data_local._4_4_ = 0;
  }
  else {
    pdVar8 = (data_elem *)lrtr_realloc(data->ary,(ulong)data->len << 4);
    if (pdVar8 == (data_elem *)0x0) {
      pdVar8 = data->ary + data->len;
      pdVar8->asn = uVar5;
      pdVar8->max_len = uVar6;
      *(undefined3 *)&pdVar8->field_0x5 = uVar7;
      pdVar8->socket = prVar2;
      data->len = data->len + 1;
      data_local._4_4_ = -1;
    }
    else {
      data->ary = pdVar8;
      data_local._4_4_ = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return data_local._4_4_;
}

Assistant:

int pfx_table_del_elem(struct node_data *data, const unsigned int index)
{
	struct data_elem *tmp;
	struct data_elem deleted_elem = data->ary[index];

	// if index is not the last elem in the list, move all other elems backwards in the array
	if (index != data->len - 1) {
		for (unsigned int i = index; i < data->len - 1; i++)
			data->ary[i] = data->ary[i + 1];
	}

	data->len--;
	if (!data->len) {
		lrtr_free(data->ary);
		data->ary = NULL;
		return PFX_SUCCESS;
	}

	tmp = lrtr_realloc(data->ary, sizeof(struct data_elem) * data->len);
	if (!tmp) {
		data->ary[data->len] = deleted_elem;
		data->len++;
		return PFX_ERROR;
	}

	data->ary = tmp;

	return PFX_SUCCESS;
}